

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableModel::removeItem(QTableModel *this,QTableWidgetItem *item)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pointer ppQVar4;
  int iVar5;
  long lVar6;
  long unaff_R12;
  int iVar7;
  long unaff_R14;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QTableWidgetItem *local_38;
  QTableWidgetItem **local_28;
  
  local_28 = *(QTableWidgetItem ***)(in_FS_OFFSET + 0x28);
  lVar2 = (this->tableItems).d.size;
  if (lVar2 == 0) {
LAB_0059d84e:
    iVar7 = -1;
  }
  else {
    lVar6 = -8;
    do {
      iVar7 = (int)unaff_R12;
      lVar1 = lVar2 * -8 + lVar6;
      if (lVar1 == -8) goto LAB_0059d848;
      unaff_R12 = lVar6 + 8;
      lVar3 = lVar6 + 8;
      lVar6 = unaff_R12;
    } while (*(QTableWidgetItem **)((long)(this->tableItems).d.ptr + lVar3) != item);
    iVar7 = (int)(unaff_R12 >> 3);
LAB_0059d848:
    if (lVar1 == -8) goto LAB_0059d84e;
  }
  if (iVar7 == -1) {
    lVar2 = (this->verticalHeaderItems).d.size;
    if (lVar2 == 0) {
LAB_0059d89c:
      unaff_R14 = -1;
    }
    else {
      lVar6 = -8;
      do {
        lVar1 = lVar2 * -8 + lVar6;
        if (lVar1 == -8) goto LAB_0059d896;
        unaff_R14 = lVar6 + 8;
        lVar3 = lVar6 + 8;
        lVar6 = unaff_R14;
      } while (*(QTableWidgetItem **)((long)(this->verticalHeaderItems).d.ptr + lVar3) != item);
      unaff_R14 = unaff_R14 >> 3;
LAB_0059d896:
      if (lVar1 == -8) goto LAB_0059d89c;
    }
    iVar7 = (int)unaff_R14;
    if (iVar7 != -1) {
      ppQVar4 = QList<QTableWidgetItem_*>::data(&this->verticalHeaderItems);
      ppQVar4[iVar7] = (QTableWidgetItem *)0x0;
      if (*(QTableWidgetItem ***)(in_FS_OFFSET + 0x28) == local_28) {
        iVar5 = 2;
        goto LAB_0059d9e2;
      }
      goto LAB_0059da14;
    }
    lVar2 = (this->horizontalHeaderItems).d.size;
    if (lVar2 == 0) {
LAB_0059d9a9:
      iVar7 = -1;
    }
    else {
      lVar6 = -8;
      do {
        iVar7 = (int)unaff_R14;
        lVar1 = lVar2 * -8 + lVar6;
        if (lVar1 == -8) goto LAB_0059d9a3;
        unaff_R14 = lVar6 + 8;
        lVar3 = lVar6 + 8;
        lVar6 = unaff_R14;
      } while (*(QTableWidgetItem **)((long)(this->horizontalHeaderItems).d.ptr + lVar3) != item);
      iVar7 = (int)(unaff_R14 >> 3);
LAB_0059d9a3:
      if (lVar1 == -8) goto LAB_0059d9a9;
    }
    if (iVar7 != -1) {
      ppQVar4 = QList<QTableWidgetItem_*>::data(&this->horizontalHeaderItems);
      ppQVar4[iVar7] = (QTableWidgetItem *)0x0;
      if (*(QTableWidgetItem ***)(in_FS_OFFSET + 0x28) == local_28) {
        iVar5 = 1;
LAB_0059d9e2:
        QAbstractItemModel::headerDataChanged((Orientation)this,iVar5,iVar7);
        return;
      }
      goto LAB_0059da14;
    }
  }
  else {
    local_38 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    index((QTableModel *)&local_48,(char *)this,(int)item);
    ppQVar4 = QList<QTableWidgetItem_*>::data(&this->tableItems);
    ppQVar4[iVar7] = (QTableWidgetItem *)0x0;
    QAbstractItemModel::dataChanged
              ((QModelIndex *)this,(QModelIndex *)&local_48,(QList_conflict *)&local_48);
  }
  if (*(QTableWidgetItem ***)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0059da14:
  __stack_chk_fail();
}

Assistant:

void QTableModel::removeItem(QTableWidgetItem *item)
{
    int i = tableItems.indexOf(item);
    if (i != -1) {
        QModelIndex idx = index(item);
        tableItems[i] = nullptr;
        emit dataChanged(idx, idx);
        return;
    }

    i = verticalHeaderItems.indexOf(item);

    if (i != -1) {
        verticalHeaderItems[i] = 0;
        emit headerDataChanged(Qt::Vertical, i, i);
        return;
    }
    i = horizontalHeaderItems.indexOf(item);
    if (i != -1) {
        horizontalHeaderItems[i] = 0;
        emit headerDataChanged(Qt::Horizontal, i, i);
        return;
    }
}